

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::IndexLocalGenerator(cmGlobalGenerator *this,cmLocalGenerator *lg)

{
  undefined8 uVar1;
  cmMakefile *this_00;
  mapped_type *ppcVar2;
  undefined1 local_38 [8];
  cmDirectoryId id;
  cmLocalGenerator *lg_local;
  cmGlobalGenerator *this_local;
  
  id.String.field_2._8_8_ = lg;
  this_00 = cmLocalGenerator::GetMakefile(lg);
  cmMakefile::GetDirectoryId((cmDirectoryId *)local_38,this_00);
  uVar1 = id.String.field_2._8_8_;
  ppcVar2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator_*>_>_>
            ::operator[](&this->LocalGeneratorSearchIndex,(key_type *)local_38);
  *ppcVar2 = (mapped_type)uVar1;
  cmDirectoryId::~cmDirectoryId((cmDirectoryId *)local_38);
  return;
}

Assistant:

void cmGlobalGenerator::IndexLocalGenerator(cmLocalGenerator* lg)
{
  cmDirectoryId id = lg->GetMakefile()->GetDirectoryId();
  this->LocalGeneratorSearchIndex[id.String] = lg;
}